

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderStorageBufferObjectTests.cpp
# Opt level: O0

long __thiscall glcts::anon_unknown_0::AdvancedWriteFragmentFS::Run(AdvancedWriteFragmentFS *this)

{
  bool bVar1;
  GLuint GVar2;
  GLint location;
  bool local_1b1;
  Vector<float,_3> local_15c;
  Vector<float,_3> local_150;
  Vector<float,_3> local_144;
  Vector<float,_3> local_138;
  int local_12c;
  int bad_pixels;
  Vector<float,_3> local_11c;
  Vector<float,_3> local_110;
  Vector<float,_3> local_104;
  undefined1 local_f8 [8];
  uvec4 zero;
  int expectedPixels;
  allocator<char> local_b9;
  string local_b8;
  char *local_98;
  char *glsl_fs1;
  char *glsl_vs1;
  string local_80;
  allocator<char> local_49;
  string local_48;
  char *local_28;
  char *glsl_fs0;
  char *glsl_vs0;
  AdvancedWriteFragmentFS *this_local;
  
  glsl_vs0 = (char *)this;
  bVar1 = ShaderStorageBufferObjectBase::IsVSFSAvailable
                    (&this->super_ShaderStorageBufferObjectBase,0,1);
  if (bVar1) {
    glsl_fs0 = 
    "\nout vec2 position;\nout vec3 color;\nvec2 g_quad[4] = vec2[4](vec2(-0.4, -0.4), vec2(0.4, -0.4), vec2(-0.4, 0.4), vec2(0.4, 0.4));\nvec2 g_offset[4] = vec2[4](vec2(-0.5, -0.5), vec2(0.5, -0.5), vec2(-0.5, 0.5), vec2(0.5, 0.5));\nvec3 g_color[4] = vec3[4](vec3(1, 0, 0), vec3(0, 1, 0), vec3(0, 0, 1), vec3(1, 1, 0));\nvoid main() {\n  vec2 pos = g_quad[gl_VertexID] + g_offset[gl_InstanceID];\n  gl_Position = vec4(pos, 0, 1);\n  position = pos;\n  color = g_color[gl_InstanceID];\n}"
    ;
    local_28 = 
    "\nin vec2 position;\nin vec3 color;\nlayout(location = 0) out vec4 g_fs_out;\nstruct FragmentData {\n  vec2 position;\n  vec3 color;\n};\nlayout(std430, binding = 3) buffer Output {\n  FragmentData g_fragment[6400];\n};\nuniform uint g_max_fragment_count;\nlayout(binding = 2, offset = 0) uniform atomic_uint g_fragment_counter;\nvoid main() {\n  uint fragment_number = atomicCounterIncrement(g_fragment_counter);\n  if (fragment_number < g_max_fragment_count) {\n    g_fragment[fragment_number].position = position;\n    g_fragment[fragment_number].color = color;\n  }\n  g_fs_out = vec4(color, 1);\n}"
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,
               "\nout vec2 position;\nout vec3 color;\nvec2 g_quad[4] = vec2[4](vec2(-0.4, -0.4), vec2(0.4, -0.4), vec2(-0.4, 0.4), vec2(0.4, 0.4));\nvec2 g_offset[4] = vec2[4](vec2(-0.5, -0.5), vec2(0.5, -0.5), vec2(-0.5, 0.5), vec2(0.5, 0.5));\nvec3 g_color[4] = vec3[4](vec3(1, 0, 0), vec3(0, 1, 0), vec3(0, 0, 1), vec3(1, 1, 0));\nvoid main() {\n  vec2 pos = g_quad[gl_VertexID] + g_offset[gl_InstanceID];\n  gl_Position = vec4(pos, 0, 1);\n  position = pos;\n  color = g_color[gl_InstanceID];\n}"
               ,&local_49);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,
               "\nin vec2 position;\nin vec3 color;\nlayout(location = 0) out vec4 g_fs_out;\nstruct FragmentData {\n  vec2 position;\n  vec3 color;\n};\nlayout(std430, binding = 3) buffer Output {\n  FragmentData g_fragment[6400];\n};\nuniform uint g_max_fragment_count;\nlayout(binding = 2, offset = 0) uniform atomic_uint g_fragment_counter;\nvoid main() {\n  uint fragment_number = atomicCounterIncrement(g_fragment_counter);\n  if (fragment_number < g_max_fragment_count) {\n    g_fragment[fragment_number].position = position;\n    g_fragment[fragment_number].color = color;\n  }\n  g_fs_out = vec4(color, 1);\n}"
               ,(allocator<char> *)((long)&glsl_vs1 + 7));
    GVar2 = ShaderStorageBufferObjectBase::CreateProgram
                      (&this->super_ShaderStorageBufferObjectBase,&local_48,&local_80);
    this->m_program[0] = GVar2;
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator((allocator<char> *)((long)&glsl_vs1 + 7));
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    glu::CallLogWrapper::glLinkProgram
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program[0]);
    bVar1 = ShaderStorageBufferObjectBase::CheckProgram
                      (&this->super_ShaderStorageBufferObjectBase,this->m_program[0]);
    if (bVar1) {
      glsl_fs1 = 
      "\nlayout(location = 0) in vec4 g_in_position;\nlayout(location = 1) in vec4 g_in_color;\nout vec3 color;\nvoid main() {\n  gl_Position = vec4(g_in_position.xy, 0, 1);\n#ifdef GL_ES\n  gl_PointSize = 1.0f;\n#endif\n  color = g_in_color.rgb;\n}"
      ;
      local_98 = 
      "\nin vec3 color;\nlayout(location = 0) out vec4 g_fs_out;\nvoid main() {\n  g_fs_out = vec4(color, 1);\n}"
      ;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,
                 "\nlayout(location = 0) in vec4 g_in_position;\nlayout(location = 1) in vec4 g_in_color;\nout vec3 color;\nvoid main() {\n  gl_Position = vec4(g_in_position.xy, 0, 1);\n#ifdef GL_ES\n  gl_PointSize = 1.0f;\n#endif\n  color = g_in_color.rgb;\n}"
                 ,&local_b9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&expectedPixels,
                 "\nin vec3 color;\nlayout(location = 0) out vec4 g_fs_out;\nvoid main() {\n  g_fs_out = vec4(color, 1);\n}"
                 ,(allocator<char> *)((long)zero.m_data + 0xf));
      GVar2 = ShaderStorageBufferObjectBase::CreateProgram
                        (&this->super_ShaderStorageBufferObjectBase,&local_b8,
                         (string *)&expectedPixels);
      this->m_program[1] = GVar2;
      std::__cxx11::string::~string((string *)&expectedPixels);
      std::allocator<char>::~allocator((allocator<char> *)((long)zero.m_data + 0xf));
      std::__cxx11::string::~string((string *)&local_b8);
      std::allocator<char>::~allocator(&local_b9);
      glu::CallLogWrapper::glLinkProgram
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->m_program[1]);
      bVar1 = ShaderStorageBufferObjectBase::CheckProgram
                        (&this->super_ShaderStorageBufferObjectBase,this->m_program[1]);
      if (bVar1) {
        zero.m_data[2] = 0x1900;
        glu::CallLogWrapper::glGenBuffers
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,1,&this->m_storage_buffer);
        glu::CallLogWrapper::glBindBufferBase
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x90d2,3,this->m_storage_buffer);
        glu::CallLogWrapper::glBufferData
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x90d2,(long)(int)(zero.m_data[2] << 5),(void *)0x0,0x88e8)
        ;
        glu::CallLogWrapper::glGenBuffers
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,1,&this->m_counter_buffer);
        glu::CallLogWrapper::glBindBufferBase
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x92c0,2,this->m_counter_buffer);
        glu::CallLogWrapper::glBufferData
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x92c0,4,(void *)0x0,0x88e8);
        tcu::Vector<unsigned_int,_4>::Vector((Vector<unsigned_int,_4> *)local_f8,0);
        glu::CallLogWrapper::glBufferSubData
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x92c0,0,4,local_f8);
        glu::CallLogWrapper::glBindTexture
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0xde1,this->m_rt);
        glu::CallLogWrapper::glTexParameteri
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0xde1,0x2801,0x2601);
        glu::CallLogWrapper::glTexParameteri
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0xde1,0x2800,0x2601);
        glu::CallLogWrapper::glTexStorage2D
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0xde1,1,0x8058,100,100);
        glu::CallLogWrapper::glBindTexture
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0xde1,0);
        glu::CallLogWrapper::glViewport
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0,0,100,100);
        glu::CallLogWrapper::glBindFramebuffer
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x8d40,this->m_fbo);
        glu::CallLogWrapper::glFramebufferTexture2D
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x8d40,0x8ce0,0xde1,this->m_rt,0);
        glu::CallLogWrapper::glGenVertexArrays
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,1,&this->m_attribless_vertex_array);
        glu::CallLogWrapper::glGenVertexArrays
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,1,&this->m_draw_vertex_array);
        glu::CallLogWrapper::glBindVertexArray
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,this->m_draw_vertex_array);
        glu::CallLogWrapper::glBindBuffer
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x8892,this->m_storage_buffer);
        glu::CallLogWrapper::glVertexAttribPointer
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0,4,0x1406,'\0',0x20,(void *)0x0);
        glu::CallLogWrapper::glVertexAttribPointer
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,1,4,0x1406,'\0',0x20,(void *)0x10);
        glu::CallLogWrapper::glBindBuffer
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x8892,0);
        glu::CallLogWrapper::glEnableVertexAttribArray
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0);
        glu::CallLogWrapper::glEnableVertexAttribArray
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,1);
        glu::CallLogWrapper::glBindVertexArray
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0);
        glu::CallLogWrapper::glClear
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x4000);
        glu::CallLogWrapper::glUseProgram
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,this->m_program[0]);
        location = glu::CallLogWrapper::glGetUniformLocation
                             (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                               super_GLWrapper.super_CallLogWrapper,this->m_program[0],
                              "g_max_fragment_count");
        glu::CallLogWrapper::glUniform1ui
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,location,zero.m_data[2]);
        glu::CallLogWrapper::glBindVertexArray
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,this->m_attribless_vertex_array);
        glu::CallLogWrapper::glDrawArraysInstanced
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,5,0,4,4);
        tcu::Vector<float,_3>::Vector(&local_104,1.0,0.0,0.0);
        tcu::Vector<float,_3>::Vector(&local_110,0.0,1.0,0.0);
        tcu::Vector<float,_3>::Vector(&local_11c,1.0,1.0,0.0);
        tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&stack0xfffffffffffffed8,0.0,0.0,1.0);
        bVar1 = ShaderStorageBufferObjectBase::ValidateWindow4Quads
                          (&this->super_ShaderStorageBufferObjectBase,&local_104,&local_110,
                           &local_11c,(vec3 *)&stack0xfffffffffffffed8,(int *)0x0);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          glu::CallLogWrapper::glClear
                    (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,0x4000);
          glu::CallLogWrapper::glUseProgram
                    (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,this->m_program[1]);
          glu::CallLogWrapper::glBindVertexArray
                    (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,this->m_draw_vertex_array);
          glu::CallLogWrapper::glMemoryBarrier
                    (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,1);
          glu::CallLogWrapper::glDrawArrays
                    (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,0,0,zero.m_data[2]);
          tcu::Vector<float,_3>::Vector(&local_138,1.0,0.0,0.0);
          tcu::Vector<float,_3>::Vector(&local_144,0.0,1.0,0.0);
          tcu::Vector<float,_3>::Vector(&local_150,1.0,1.0,0.0);
          tcu::Vector<float,_3>::Vector(&local_15c,0.0,0.0,1.0);
          local_1b1 = ShaderStorageBufferObjectBase::ValidateWindow4Quads
                                (&this->super_ShaderStorageBufferObjectBase,&local_138,&local_144,
                                 &local_150,&local_15c,&local_12c);
          local_1b1 = local_1b1 || local_12c < 3;
          if (local_1b1) {
            this_local = (AdvancedWriteFragmentFS *)0x0;
          }
          else {
            this_local = (AdvancedWriteFragmentFS *)&DAT_ffffffffffffffff;
          }
        }
        else {
          this_local = (AdvancedWriteFragmentFS *)&DAT_ffffffffffffffff;
        }
      }
      else {
        this_local = (AdvancedWriteFragmentFS *)&DAT_ffffffffffffffff;
      }
    }
    else {
      this_local = (AdvancedWriteFragmentFS *)&DAT_ffffffffffffffff;
    }
  }
  else {
    this_local = (AdvancedWriteFragmentFS *)0x10;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		if (!IsVSFSAvailable(0, 1))
			return NOT_SUPPORTED;
		const char* const glsl_vs0 =
			NL "out vec2 position;" NL "out vec3 color;" NL
			   "vec2 g_quad[4] = vec2[4](vec2(-0.4, -0.4), vec2(0.4, -0.4), vec2(-0.4, 0.4), vec2(0.4, 0.4));" NL
			   "vec2 g_offset[4] = vec2[4](vec2(-0.5, -0.5), vec2(0.5, -0.5), vec2(-0.5, 0.5), vec2(0.5, 0.5));" NL
			   "vec3 g_color[4] = vec3[4](vec3(1, 0, 0), vec3(0, 1, 0), vec3(0, 0, 1), vec3(1, 1, 0));" NL
			   "void main() {" NL "  vec2 pos = g_quad[gl_VertexID] + g_offset[gl_InstanceID];" NL
			   "  gl_Position = vec4(pos, 0, 1);" NL "  position = pos;" NL "  color = g_color[gl_InstanceID];" NL "}";
		const char* const glsl_fs0 =
			NL "in vec2 position;" NL "in vec3 color;" NL "layout(location = 0) out vec4 g_fs_out;" NL
			   "struct FragmentData {" NL "  vec2 position;" NL "  vec3 color;" NL "};" NL
			   "layout(std430, binding = 3) buffer Output {" NL "  FragmentData g_fragment[6400];" NL "};" NL
			   "uniform uint g_max_fragment_count;" NL
			   "layout(binding = 2, offset = 0) uniform atomic_uint g_fragment_counter;" NL "void main() {" NL
			   "  uint fragment_number = atomicCounterIncrement(g_fragment_counter);" NL
			   "  if (fragment_number < g_max_fragment_count) {" NL
			   "    g_fragment[fragment_number].position = position;" NL
			   "    g_fragment[fragment_number].color = color;" NL "  }" NL "  g_fs_out = vec4(color, 1);" NL "}";
		m_program[0] = CreateProgram(glsl_vs0, glsl_fs0);
		glLinkProgram(m_program[0]);
		if (!CheckProgram(m_program[0]))
			return ERROR;

		const char* const glsl_vs1 =
			NL "layout(location = 0) in vec4 g_in_position;" NL "layout(location = 1) in vec4 g_in_color;" NL
			   "out vec3 color;" NL "void main() {" NL "  gl_Position = vec4(g_in_position.xy, 0, 1);" NL
			   "#ifdef GL_ES" NL "  gl_PointSize = 1.0f;" NL "#endif" NL "  color = g_in_color.rgb;" NL "}";
		const char* const glsl_fs1 = NL "in vec3 color;" NL "layout(location = 0) out vec4 g_fs_out;" NL
										"void main() {" NL "  g_fs_out = vec4(color, 1);" NL "}";
		m_program[1] = CreateProgram(glsl_vs1, glsl_fs1);
		glLinkProgram(m_program[1]);
		if (!CheckProgram(m_program[1]))
			return ERROR;

		// The first pass renders four squares on-screen, and writes a
		// record to the SSBO for each fragment processed.  The rectangles
		// will be 40x40 when using a 100x100 viewport, so we expect 1600
		// pixels per rectangle or 6400 pixels total.  Size the SSBO
		// accordingly, and render the second pass (sourcing the SSBO as a
		// vertex buffer) with an identical number of points.  If we have
		// a larger buffer and draw more points on the second pass, those
		// may overwrite "real" points using garbage position/color.
		int expectedPixels = 6400;

		glGenBuffers(1, &m_storage_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 3, m_storage_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, expectedPixels * 32, NULL, GL_DYNAMIC_DRAW);

		glGenBuffers(1, &m_counter_buffer);
		glBindBufferBase(GL_ATOMIC_COUNTER_BUFFER, 2, m_counter_buffer);
		glBufferData(GL_ATOMIC_COUNTER_BUFFER, 4, NULL, GL_DYNAMIC_DRAW);
		uvec4 zero(0);
		glBufferSubData(GL_ATOMIC_COUNTER_BUFFER, 0, 4, &zero);

		glBindTexture(GL_TEXTURE_2D, m_rt);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
		glTexStorage2D(GL_TEXTURE_2D, 1, GL_RGBA8, 100, 100);
		glBindTexture(GL_TEXTURE_2D, 0);
		glViewport(0, 0, 100, 100);
		glBindFramebuffer(GL_FRAMEBUFFER, m_fbo);
		glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_rt, 0);

		glGenVertexArrays(1, &m_attribless_vertex_array);

		glGenVertexArrays(1, &m_draw_vertex_array);
		glBindVertexArray(m_draw_vertex_array);
		glBindBuffer(GL_ARRAY_BUFFER, m_storage_buffer);
		glVertexAttribPointer(0, 4, GL_FLOAT, GL_FALSE, 32, 0);
		glVertexAttribPointer(1, 4, GL_FLOAT, GL_FALSE, 32, reinterpret_cast<void*>(16));
		glBindBuffer(GL_ARRAY_BUFFER, 0);
		glEnableVertexAttribArray(0);
		glEnableVertexAttribArray(1);
		glBindVertexArray(0);

		glClear(GL_COLOR_BUFFER_BIT);
		glUseProgram(m_program[0]);
		glUniform1ui(glGetUniformLocation(m_program[0], "g_max_fragment_count"), expectedPixels);
		glBindVertexArray(m_attribless_vertex_array);
		glDrawArraysInstanced(GL_TRIANGLE_STRIP, 0, 4, 4);
		if (!ValidateWindow4Quads(vec3(1, 0, 0), vec3(0, 1, 0), vec3(1, 1, 0), vec3(0, 0, 1)))
		{
			return ERROR;
		}

		glClear(GL_COLOR_BUFFER_BIT);
		glUseProgram(m_program[1]);
		glBindVertexArray(m_draw_vertex_array);
		glMemoryBarrier(GL_VERTEX_ATTRIB_ARRAY_BARRIER_BIT);
		glDrawArrays(GL_POINTS, 0, expectedPixels);
		int bad_pixels;
		if (!ValidateWindow4Quads(vec3(1, 0, 0), vec3(0, 1, 0), vec3(1, 1, 0), vec3(0, 0, 1), &bad_pixels) &&
			bad_pixels > 2)
		{
			return ERROR;
		}

		return NO_ERROR;
	}